

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand
          (cmGlobalUnixMakefileGenerator3 *this,string *sourceFile,string *workingDirectory,
          string *compileCommand,string *objPath)

{
  cmGeneratedFileStream *pcVar1;
  pointer pcVar2;
  string *psVar3;
  cmGeneratedFileStream *this_00;
  ostream *poVar4;
  string commandDatabaseName;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (this->CommandDatabase)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar1 == (cmGeneratedFileStream *)0x0) {
    psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar2 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + psVar3->_M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    this_00 = (cmGeneratedFileStream *)operator_new(0x268);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&local_b0,false,None);
    pcVar1 = (this->CommandDatabase)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    (this->CommandDatabase)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = this_00;
    if (pcVar1 != (cmGeneratedFileStream *)0x0) {
      (**(code **)(*(long *)&(pcVar1->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      this_00 = (this->CommandDatabase)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar1,",\n",2);
  }
  pcVar1 = (this->CommandDatabase)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar1,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar1,"  \"directory\": \"",0x10);
  cmGlobalGenerator::EscapeJSON(&local_b0,workingDirectory);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar1,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  \"command\": \"",0xe);
  cmGlobalGenerator::EscapeJSON(&local_50,compileCommand);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  \"file\": \"",0xb);
  cmGlobalGenerator::EscapeJSON(&local_70,sourceFile);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  \"output\": \"",0xd);
  cmGlobalGenerator::EscapeJSON(&local_90,objPath);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n}",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand(
  const std::string& sourceFile, const std::string& workingDirectory,
  const std::string& compileCommand, const std::string& objPath)
{
  if (!this->CommandDatabase) {
    std::string commandDatabaseName =
      this->GetCMakeInstance()->GetHomeOutputDirectory() +
      "/compile_commands.json";
    this->CommandDatabase =
      cm::make_unique<cmGeneratedFileStream>(commandDatabaseName);
    *this->CommandDatabase << "[\n";
  } else {
    *this->CommandDatabase << ",\n";
  }
  *this->CommandDatabase << "{\n"
                         << R"(  "directory": ")"
                         << cmGlobalGenerator::EscapeJSON(workingDirectory)
                         << "\",\n"
                         << R"(  "command": ")"
                         << cmGlobalGenerator::EscapeJSON(compileCommand)
                         << "\",\n"
                         << R"(  "file": ")"
                         << cmGlobalGenerator::EscapeJSON(sourceFile)
                         << "\",\n"
                         << R"(  "output": ")"
                         << cmGlobalGenerator::EscapeJSON(objPath) << "\"\n}";
}